

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# echo_server.cpp
# Opt level: O2

void __thiscall EchoServer::echo_message_cb(EchoServer *this,TcpConnSP *conn,InputBuffer *ibuf)

{
  int iVar1;
  char *pcVar2;
  size_t in_RCX;
  uint in_R8D;
  string msg_str;
  
  pcVar2 = InputBuffer::get_from_buf(ibuf);
  iVar1 = BufferBase::length(&ibuf->super_BufferBase);
  msg_str._M_dataplus._M_p = (pointer)&msg_str.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&msg_str,pcVar2,pcVar2 + iVar1);
  iVar1 = BufferBase::length(&ibuf->super_BufferBase);
  BufferBase::pop(&ibuf->super_BufferBase,iVar1);
  InputBuffer::adjust(ibuf);
  if (1 < pr_level) {
    in_R8D = ((conn->super___shared_ptr<TcpConnection,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->tc_fd;
    in_RCX = 0x23;
    printf("[%-5s][%s:%d] socket fd %d recv message:%s","info","echo_message_cb",0x23,(ulong)in_R8D,
           msg_str._M_dataplus._M_p);
  }
  TcpConnection::send((conn->super___shared_ptr<TcpConnection,_(__gnu_cxx::_Lock_policy)2>)._M_ptr,
                      (int)msg_str._M_dataplus._M_p,(void *)(ulong)(uint)msg_str._M_string_length,
                      in_RCX,in_R8D);
  std::__cxx11::string::~string((string *)&msg_str);
  return;
}

Assistant:

void echo_message_cb(const TcpConnSP& conn, InputBuffer* ibuf) {
        
        const char *msg = ibuf->get_from_buf();
        string msg_str(msg, msg+ibuf->length());
        ibuf->pop(ibuf->length());
        ibuf->adjust();
    
        PR_INFO("socket fd %d recv message:%s", conn->get_fd(), msg_str.c_str());

        conn->send(msg_str.c_str(), msg_str.length());
    }